

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Serializer.cpp
# Opt level: O1

void __thiscall
adios2::format::BP3Serializer::AggregateCollectiveMetadata
          (BP3Serializer *this,Comm *comm,BufferSTL *bufferSTL,bool inMetadataBuffer)

{
  _func_int *p_Var1;
  int iVar2;
  size_t sVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indicesPosition;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  p_Var1 = (this->super_BP3Base)._vptr_BP3Base[-3];
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"buffering","");
  profiling::IOChrono::Start
            ((IOChrono *)(&(this->super_BP3Base).field_0x278 + (long)p_Var1),&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  p_Var1 = (this->super_BP3Base)._vptr_BP3Base[-3];
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"meta_sort_merge","");
  profiling::IOChrono::Start
            ((IOChrono *)(&(this->super_BP3Base).field_0x278 + (long)p_Var1),&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  AggregateCollectiveMetadataIndices(&local_e8,this,comm,bufferSTL);
  iVar2 = helper::Comm::Rank(comm);
  if (iVar2 == 0) {
    BPSerializer::PutMinifooter
              ((BPSerializer *)&(this->super_BP3Base).field_0x8,
               *local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start,
               local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[1],
               local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[2],&bufferSTL->m_Buffer,
               &(bufferSTL->super_Buffer).m_Position,inMetadataBuffer);
    if (inMetadataBuffer) {
      sVar3 = 0;
    }
    else {
      sVar3 = (bufferSTL->super_Buffer).m_AbsolutePosition;
    }
    (bufferSTL->super_Buffer).m_AbsolutePosition = sVar3 + (bufferSTL->super_Buffer).m_Position;
  }
  sVar3 = (bufferSTL->super_Buffer).m_Position;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"after collective metadata is done","");
  BufferSTL::Resize(bufferSTL,sVar3,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  p_Var1 = (this->super_BP3Base)._vptr_BP3Base[-3];
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"meta_sort_merge","");
  profiling::IOChrono::Stop
            ((IOChrono *)(&(this->super_BP3Base).field_0x278 + (long)p_Var1),&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  p_Var1 = (this->super_BP3Base)._vptr_BP3Base[-3];
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"buffering","");
  profiling::IOChrono::Stop
            ((IOChrono *)(&(this->super_BP3Base).field_0x278 + (long)p_Var1),&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (uint64_t *)0x0) {
    operator_delete(local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BP3Serializer::AggregateCollectiveMetadata(helper::Comm const &comm, BufferSTL &bufferSTL,
                                                const bool inMetadataBuffer)
{
    m_Profiler.Start("buffering");
    m_Profiler.Start("meta_sort_merge");

    const std::vector<size_t> indicesPosition = AggregateCollectiveMetadataIndices(comm, bufferSTL);

    int rank = comm.Rank();
    if (rank == 0)
    {
        PutMinifooter(static_cast<uint64_t>(indicesPosition[0]),
                      static_cast<uint64_t>(indicesPosition[1]),
                      static_cast<uint64_t>(indicesPosition[2]), bufferSTL.m_Buffer,
                      bufferSTL.m_Position, inMetadataBuffer);

        if (inMetadataBuffer)
        {
            bufferSTL.m_AbsolutePosition = bufferSTL.m_Position;
        }
        else
        {
            bufferSTL.m_AbsolutePosition += bufferSTL.m_Position;
        }
    }

    bufferSTL.Resize(bufferSTL.m_Position, "after collective metadata is done");

    m_Profiler.Stop("meta_sort_merge");
    m_Profiler.Stop("buffering");
}